

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

int vs_byte(bitstream *str)

{
  uint8_t uVar1;
  uint uVar2;
  int iVar3;
  uint8_t *puVar4;
  byte bVar5;
  ulong uVar6;
  char *__format;
  int iVar7;
  long lVar8;
  
  if (str->dir == VS_ENCODE) {
    switch(str->type) {
    case VS_H261:
    case VS_H263:
      break;
    case VS_H262:
      uVar6 = (ulong)str->curbyte;
      if ((str->curbyte < 2) && (1 < str->zero_bytes)) {
        __format = "00 00 0%d emitted!\n";
        goto LAB_001014e2;
      }
      break;
    case VS_H264:
      if ((str->curbyte < 4) && (str->zero_bytes == 2)) {
        iVar3 = str->bytesnum;
        iVar7 = str->bytesmax;
        if (iVar3 < iVar7) {
          puVar4 = str->bytes;
        }
        else {
          iVar3 = iVar7 * 2;
          if (iVar7 == 0) {
            iVar3 = 0x10;
          }
          str->bytesmax = iVar3;
          puVar4 = (uint8_t *)realloc(str->bytes,(long)iVar3);
          str->bytes = puVar4;
          iVar3 = str->bytesnum;
        }
        str->bytesnum = iVar3 + 1;
        puVar4[iVar3] = '\x03';
        str->zero_bytes = 0;
      }
      break;
    default:
switchD_00101332_default:
      abort();
    }
    iVar3 = str->bytesnum;
    iVar7 = str->bytesmax;
    if (iVar3 < iVar7) {
      puVar4 = str->bytes;
    }
    else {
      iVar3 = iVar7 * 2;
      if (iVar7 == 0) {
        iVar3 = 0x10;
      }
      str->bytesmax = iVar3;
      puVar4 = (uint8_t *)realloc(str->bytes,(long)iVar3);
      str->bytes = puVar4;
      iVar3 = str->bytesnum;
    }
    uVar1 = str->curbyte;
    str->bytesnum = iVar3 + 1;
    puVar4[iVar3] = uVar1;
    iVar3 = 0;
    if (uVar1 == '\0') {
      iVar3 = str->zero_bytes + 1;
    }
    str->zero_bytes = iVar3;
    str->curbyte = '\0';
    goto LAB_001013ea;
  }
  iVar3 = str->bytepos;
  if (str->bytesnum <= iVar3) {
LAB_0010147d:
    fwrite("End of bitstream in a NAL!\n",0x1b,1,_stderr);
    return 1;
  }
  lVar8 = (long)iVar3 + 1;
  iVar7 = (int)lVar8;
  str->bytepos = iVar7;
  bVar5 = str->bytes[iVar3];
  str->curbyte = bVar5;
  if (VS_H264 < str->type) goto switchD_00101332_default;
  uVar2 = (uint)bVar5;
  switch(str->type) {
  case VS_H262:
    if (bVar5 < 2) {
      if (1 < str->zero_bytes) {
LAB_001014cf:
        __format = "00 00 0%d read in a NAL!\n";
        uVar6 = (ulong)uVar2;
LAB_001014e2:
        fprintf(_stderr,__format,uVar6);
        return 1;
      }
      break;
    }
    goto LAB_001013df;
  case VS_H264:
    if (str->zero_bytes == 2) {
      if (uVar2 != 3) {
        if (uVar2 < 3) goto LAB_001014cf;
        goto LAB_001013df;
      }
      if (str->bytesnum <= iVar7) goto LAB_0010147d;
      str->zero_bytes = 0;
      str->bytepos = iVar3 + 2;
      bVar5 = str->bytes[lVar8];
      uVar6 = (ulong)bVar5;
      str->curbyte = bVar5;
      if (3 < bVar5) {
        __format = "Invalid escape sequence: 00 00 03 %02x!\n";
        goto LAB_001014e2;
      }
    }
  }
  if (bVar5 == 0) {
    str->zero_bytes = str->zero_bytes + 1;
  }
  else {
LAB_001013df:
    str->zero_bytes = 0;
  }
  str->hasbyte = 1;
LAB_001013ea:
  str->bitpos = 7;
  return 0;
}

Assistant:

int vs_byte(struct bitstream *str) {
	if (str->dir == VS_ENCODE) {
		switch (str->type) {
			case VS_H262:
				if (str->curbyte < 2 && str->zero_bytes >= 2) {
					fprintf(stderr, "00 00 0%d emitted!\n", str->curbyte);
					return 1;
				}
				break;
			case VS_H264:
				if (str->curbyte < 4 && str->zero_bytes == 2) {
					/* escape */
					ADDARRAY(str->bytes, 3);
					str->zero_bytes = 0;
				}
				break;
			case VS_H261:
			case VS_H263:
				/* start codes not byte-oriented in these */
				break;
			default:
				abort();
		}
		ADDARRAY(str->bytes, str->curbyte);
		if (!str->curbyte)
			str->zero_bytes++;
		else
			str->zero_bytes = 0;
		str->curbyte = 0;
	} else {
		if (str->bytepos >= str->bytesnum) {
			fprintf(stderr, "End of bitstream in a NAL!\n");
			return 1;
		}
		str->curbyte = str->bytes[str->bytepos++];
		switch (str->type) {
			case VS_H262:
				if (str->curbyte < 2 && str->zero_bytes >= 2) {
					fprintf(stderr, "00 00 0%d read in a NAL!\n", str->curbyte);
					return 1;
				}
				break;
			case VS_H264:
				if (str->zero_bytes == 2) {
					switch (str->curbyte) {
						case 0:
						case 1:
						case 2:
							fprintf(stderr, "00 00 0%d read in a NAL!\n", str->curbyte);
							return 1;
						case 3:
							if (str->bytepos >= str->bytesnum) {
								fprintf(stderr, "End of bitstream in a NAL!\n");
								return 1;
							}
							str->zero_bytes = 0;
							str->curbyte = str->bytes[str->bytepos++];
							if (str->curbyte > 3) {
								fprintf(stderr, "Invalid escape sequence: 00 00 03 %02x!\n", str->curbyte);
								return 1;
							}
							break;
					}
				}
				break;
			case VS_H261:
			case VS_H263:
				/* start codes not byte-oriented in these */
				break;
			default:
				abort();
		}
		if (!str->curbyte)
			str->zero_bytes++;
		else
			str->zero_bytes = 0;
		str->hasbyte = 1;
	}
	str->bitpos = 7;
	return 0;
}